

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxOutByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **asset_string,
              int64_t *value_satoshi,char **value_commitment,char **nonce,char **locking_script,
              char **surjection_proof,char **rangeproof)

{
  bool bVar1;
  int64_t iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  CfdException *pCVar8;
  Amount AVar9;
  bool is_bitcoin;
  char *work_surjection_proof;
  char *work_locking_script;
  char *work_nonce;
  char *work_value_commitment;
  char *work_asset_string;
  void *local_1c8;
  undefined1 local_1c0 [56];
  string local_188;
  undefined8 local_168;
  char *local_160;
  char **local_158;
  ConfidentialValue value;
  ConfidentialTxOutReference ref;
  
  work_asset_string = (char *)0x0;
  work_value_commitment = (char *)0x0;
  work_nonce = (char *)0x0;
  work_locking_script = (char *)0x0;
  work_surjection_proof = (char *)0x0;
  local_168 = 0;
  local_1c8 = handle;
  local_158 = asset_string;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"TransactionData",(allocator *)local_1c0);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  if (*(ConfidentialTransaction **)((long)tx_data_handle + 0x18) == (ConfidentialTransaction *)0x0)
  {
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Invalid handle state. tx is null",(allocator *)local_1c0);
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&ref);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    cfd::core::ConfidentialTransaction::GetTxOut
              (&ref,*(ConfidentialTransaction **)((long)tx_data_handle + 0x18),index);
    if (local_158 == (char **)0x0) {
      local_160 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_1c0,&ref.asset_);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&value,(ConfidentialAssetId *)local_1c0);
      work_asset_string = cfd::capi::CreateString((string *)&value);
      local_160 = work_asset_string;
      std::__cxx11::string::~string((string *)&value);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_1c0);
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&value,&ref.confidential_value_);
    if (value_satoshi != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(&value);
      if (!bVar1) {
        AVar9 = cfd::core::ConfidentialValue::GetAmount(&value);
        local_1c0._0_8_ = AVar9.amount_;
        local_1c0[8] = AVar9.ignore_check_;
        iVar2 = cfd::core::Amount::GetSatoshiValue((Amount *)local_1c0);
        *value_satoshi = iVar2;
      }
    }
    if (value_commitment == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_1c0,&value);
      pcVar3 = cfd::capi::CreateString((string *)local_1c0);
      work_value_commitment = pcVar3;
      std::__cxx11::string::~string((string *)local_1c0);
    }
    if (nonce == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_1c0,&ref.nonce_);
      cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_188,(ConfidentialNonce *)local_1c0);
      pcVar4 = cfd::capi::CreateString(&local_188);
      work_nonce = pcVar4;
      std::__cxx11::string::~string((string *)&local_188);
      cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_1c0);
    }
    if (locking_script == (char **)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      cfd::core::Script::Script
                ((Script *)local_1c0,&ref.super_AbstractTxOutReference.locking_script_);
      cfd::core::Script::GetHex_abi_cxx11_(&local_188,(Script *)local_1c0);
      pcVar5 = cfd::capi::CreateString(&local_188);
      work_locking_script = pcVar5;
      std::__cxx11::string::~string((string *)&local_188);
      cfd::core::Script::~Script((Script *)local_1c0);
    }
    if (surjection_proof == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
                 &ref.surjection_proof_.data_);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1c0,(ByteData *)&local_188);
      pcVar6 = cfd::capi::CreateString((string *)local_1c0);
      work_surjection_proof = pcVar6;
      std::__cxx11::string::~string((string *)local_1c0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
    }
    if (rangeproof == (char **)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,
                 &ref.range_proof_.data_);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1c0,(ByteData *)&local_188);
      pcVar7 = cfd::capi::CreateString((string *)local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
    }
    if (local_160 != (char *)0x0) {
      *local_158 = local_160;
    }
    if (pcVar3 != (char *)0x0) {
      *value_commitment = pcVar3;
    }
    if (pcVar4 != (char *)0x0) {
      *nonce = pcVar4;
    }
    if (pcVar5 != (char *)0x0) {
      *locking_script = pcVar5;
    }
    if (pcVar6 != (char *)0x0) {
      *surjection_proof = pcVar6;
    }
    if (pcVar7 != (char *)0x0) {
      *rangeproof = pcVar7;
    }
    cfd::core::ConfidentialValue::~ConfidentialValue(&value);
    cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&ref);
    return 0;
  }
  pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Invalid handle state. tx is bitcoin.",(allocator *)local_1c0);
  cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&ref);
  __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** asset_string,
    int64_t* value_satoshi, char** value_commitment, char** nonce,
    char** locking_script, char** surjection_proof, char** rangeproof) {
  char* work_asset_string = nullptr;
  char* work_value_commitment = nullptr;
  char* work_nonce = nullptr;
  char* work_locking_script = nullptr;
  char* work_surjection_proof = nullptr;
  char* work_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxOutReference ref = tx->GetTxOut(index);

    if (asset_string != nullptr) {
      work_asset_string = CreateString(ref.GetAsset().GetHex());
    }
    ConfidentialValue value = ref.GetConfidentialValue();
    if ((value_satoshi != nullptr) && (!value.HasBlinding())) {
      *value_satoshi = value.GetAmount().GetSatoshiValue();
    }
    if (value_commitment != nullptr) {
      work_value_commitment = CreateString(value.GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(ref.GetNonce().GetHex());
    }
    if (locking_script != nullptr) {
      work_locking_script = CreateString(ref.GetLockingScript().GetHex());
    }
    if (surjection_proof != nullptr) {
      work_surjection_proof = CreateString(ref.GetSurjectionProof().GetHex());
    }
    if (rangeproof != nullptr) {
      work_rangeproof = CreateString(ref.GetRangeProof().GetHex());
    }

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    if (work_value_commitment != nullptr)
      *value_commitment = work_value_commitment;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_surjection_proof != nullptr)
      *surjection_proof = work_surjection_proof;
    if (work_rangeproof != nullptr) *rangeproof = work_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}